

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_thread.cpp
# Opt level: O2

void __thiscall
incrementer<booster::shared_mutex>::operator()(incrementer<booster::shared_mutex> *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  unique_lock<booster::shared_mutex> ul;
  
  iVar2 = 5;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    std::unique_lock<booster::shared_mutex>::unique_lock(&ul,this->mutex_);
    iVar1 = variable;
    booster::ptime::millisleep(0x14);
    variable = iVar1 + 1;
    std::unique_lock<booster::shared_mutex>::~unique_lock(&ul);
  }
  return;
}

Assistant:

void operator()()
	{
		for(int i=0;i<5;i++) {
			{
				booster::unique_lock<MutexType> ul(*mutex_);
				int tmp = variable;
				booster::ptime::millisleep(20);
				variable = tmp + 1;
			}
		}
	}